

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O1

string * __thiscall test_argsort::vars_abi_cxx11_(string *__return_storage_ptr__,test_argsort *this)

{
  size_type *psVar1;
  ggml_sort_order gVar2;
  ggml_sort_order __val;
  undefined8 uVar3;
  uint uVar4;
  char *__s;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  uint __len;
  string __str;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  __s = (char *)ggml_type_name(this->type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,__s,(allocator<char> *)&local_150);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x158f46);
  local_b0 = &local_a0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar5[3];
  }
  else {
    local_a0 = *plVar8;
    local_b0 = (long *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_120 = *puVar9;
    lStack_118 = plVar5[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar9;
    local_130 = (ulong *)*plVar5;
  }
  local_128 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  var_to_str<long,4ul>(&local_70,&this->ne);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x158fbc);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_140 = *puVar9;
    lStack_138 = plVar5[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar9;
    local_150 = (ulong *)*plVar5;
  }
  local_148 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar10 = 0xf;
  if (local_130 != &local_120) {
    uVar10 = local_120;
  }
  if (uVar10 < (ulong)(local_148 + local_128)) {
    uVar10 = 0xf;
    if (local_150 != &local_140) {
      uVar10 = local_140;
    }
    if (uVar10 < (ulong)(local_148 + local_128)) goto LAB_0013f36e;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013f36e:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_150);
  }
  local_f0 = &local_e0;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_e0 = *plVar5;
    uStack_d8 = puVar6[3];
  }
  else {
    local_e0 = *plVar5;
    local_f0 = (long *)*puVar6;
  }
  local_e8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_c0 = *puVar9;
    lStack_b8 = plVar5[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar9;
    local_d0 = (ulong *)*plVar5;
  }
  local_c8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  gVar2 = this->order;
  __val = -gVar2;
  if (0 < (int)gVar2) {
    __val = gVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_0013f49d;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_0013f49d;
      }
      if (uVar7 < 10000) goto LAB_0013f49d;
      uVar10 = uVar10 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_0013f49d:
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct((ulong)local_90,(char)__len - (char)((int)gVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(gVar2 >> 0x1f) + (long)local_90[0]),__len,__val);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x1592af);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_100 = *puVar9;
    lStack_f8 = plVar5[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar9;
    local_110 = (ulong *)*plVar5;
  }
  local_108 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar10 = 0xf;
  if (local_d0 != &local_c0) {
    uVar10 = local_c0;
  }
  if (uVar10 < (ulong)(local_108 + local_c8)) {
    uVar10 = 0xf;
    if (local_110 != &local_100) {
      uVar10 = local_100;
    }
    if ((ulong)(local_108 + local_c8) <= uVar10) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_d0);
      goto LAB_0013f5a3;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_110);
LAB_0013f5a3:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar3 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR3(type, ne, order);
    }